

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall duckdb_re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  uint uVar1;
  int *piVar2;
  Prog *pPVar3;
  Inst *pIVar4;
  MatchKind MVar5;
  int *inst;
  ulong uVar6;
  State *pSVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  int *piVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint ninst;
  Workq *pWVar17;
  int *ip;
  new_allocator<int> local_59;
  ulong local_58;
  undefined8 local_50;
  DFA *local_48;
  Workq *local_40;
  uint local_34;
  
  ninst = 0;
  local_40 = mq;
  inst = __gnu_cxx::new_allocator<int>::allocate
                   (&local_59,(long)q->maxmark_ + (long)q->n_,(void *)0x0);
  if ((q->super_SparseSet).size_ == 0) {
    uVar11 = flag & 0x100;
    ninst = 0;
    local_50 = (ulong)local_50._4_4_ << 0x20;
  }
  else {
    piVar2 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
             _M_head_impl;
    MVar5 = this->kind_;
    pPVar3 = this->prog_;
    lVar14 = 0;
    uVar15 = 0;
    bVar13 = 0;
    local_50 = 0;
    do {
      iVar8 = *(int *)((long)piVar2 + lVar14);
      if ((bVar13 & 1) == 0) {
        iVar16 = q->n_;
      }
      else if ((MVar5 == kFirstMatch) || (iVar16 = q->n_, iVar16 <= iVar8)) break;
      if (iVar8 < iVar16) {
        pIVar4 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                 ((long)&(pPVar3->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        uVar11 = pIVar4[iVar8].out_opcode_;
        if (((uVar11 & 7) == 1) && (MVar5 != kManyMatch)) {
          if (MVar5 == kLongestMatch) {
            if ((flag >> 8 & 1) != 0 && (char)local_50 == '\0') {
LAB_0182eb84:
              pSVar7 = (State *)0x2;
              local_48 = this;
              goto LAB_0182eb65;
            }
          }
          else if (MVar5 == kFirstMatch) {
            if (lVar14 == 0) {
              uVar1 = pIVar4[uVar11 >> 4].out_opcode_;
              local_58 = (ulong)uVar1;
              if ((uVar1 & 7) == 2) goto LAB_0182e948;
              if ((((uVar1 & 7) == 6) && ((flag >> 8 & 1) != 0)) &&
                 ((pIVar4[uVar1 >> 4].out_opcode_ & 7) == 2)) goto LAB_0182eb84;
            }
          }
          else {
LAB_0182e948:
            if ((flag >> 8 & 1) != 0) goto LAB_0182eb84;
          }
        }
        if ((pIVar4[(long)iVar8 + -1].out_opcode_ & 8) != 0) {
          lVar9 = (long)(int)ninst;
          ninst = ninst + 1;
          inst[lVar9] = iVar8;
          uVar11 = pIVar4[iVar8].out_opcode_;
        }
        if ((uVar11 & 7) == 5) {
          bVar13 = bVar13 | pPVar3->anchor_end_ ^ 1U;
        }
        else if ((uVar11 & 7) == 4) {
          uVar15 = uVar15 | pIVar4[iVar8].field_1.out1_;
        }
      }
      else if ((0 < (int)ninst) && (inst[(ulong)ninst - 1] != -1)) {
        inst[ninst] = -1;
        local_50 = CONCAT71((uint7)(uint3)(ninst >> 8),1);
        ninst = ninst + 1;
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != (long)(q->super_SparseSet).size_ * 4);
    if ((0 < (int)ninst) && (inst[ninst - 1] == -1)) {
      ninst = ninst - 1;
    }
    uVar11 = flag & 0x100;
    if (uVar15 != 0) {
      uVar11 = flag;
    }
    local_50 = (ulong)(uVar15 << 0x10);
    local_48 = this;
  }
  if (ninst == 0 && uVar11 == 0) {
    pSVar7 = (State *)&DAT_00000001;
    goto LAB_0182eb65;
  }
  MVar5 = this->kind_;
  local_58 = (ulong)(int)ninst;
  if (MVar5 == kLongestMatch) {
    pWVar17 = local_40;
    if (0 < (int)ninst) {
      piVar2 = inst + local_58;
      piVar12 = inst;
      local_34 = uVar11;
      local_48 = this;
      piVar10 = inst;
LAB_0182ea42:
      do {
        iVar8 = *piVar12;
        if (iVar8 != -1) {
          piVar12 = piVar12 + 1;
          if (piVar12 < piVar2) goto LAB_0182ea42;
        }
        if (piVar10 != piVar12) {
          uVar6 = (long)piVar12 - (long)piVar10 >> 2;
          lVar14 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar10,piVar12,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar10,piVar12);
        }
        piVar12 = piVar12 + (iVar8 == -1);
        piVar10 = piVar12;
      } while (piVar12 < piVar2);
      MVar5 = local_48->kind_;
      this = local_48;
      uVar11 = local_34;
      goto LAB_0182eab2;
    }
  }
  else {
LAB_0182eab2:
    pWVar17 = local_40;
    if ((MVar5 == kManyMatch) && (ninst != 0)) {
      piVar2 = inst + local_58;
      lVar14 = 0x3f;
      if (local_58 != 0) {
        for (; local_58 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (inst,piVar2,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(inst,piVar2);
    }
  }
  if (pWVar17 != (Workq *)0x0) {
    ninst = ninst + 1;
    inst[local_58] = -2;
    iVar8 = (pWVar17->super_SparseSet).size_;
    if (iVar8 != 0) {
      piVar2 = ((_Head_base<0UL,_int_*,_false> *)
               ((long)&(pWVar17->super_SparseSet).dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
               _M_head_impl;
      pIVar4 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
               ((long)&(this->prog_->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               + 8))->_M_head_impl;
      piVar12 = piVar2;
      do {
        if ((pIVar4[*piVar12].out_opcode_ & 7) == 5) {
          lVar14 = (long)(int)ninst;
          ninst = ninst + 1;
          *(anon_union_4_5_a14c903b_for_Inst_2 *)(inst + lVar14) = pIVar4[*piVar12].field_1;
          iVar8 = (pWVar17->super_SparseSet).size_;
        }
        piVar12 = piVar12 + 1;
      } while (piVar12 != piVar2 + iVar8);
    }
  }
  pSVar7 = CachedState(this,inst,ninst,uVar11 | (uint)local_50);
LAB_0182eb65:
  if (inst != (int *)0x0) {
    operator_delete(inst);
  }
  return pSVar7;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  PODArray<int> inst(q->size());
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark

  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst.data(), n, flag);
  return state;
}